

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3ExprParse(ParseContext *pParse,char *z,int n,Fts3Expr **ppExpr,int *pnConsumed)

{
  undefined8 *in_RCX;
  int in_EDX;
  ParseContext *in_R8;
  Fts3Expr *pIter;
  Fts3Expr *pAnd;
  int eType;
  Fts3Expr *pNot;
  int isPhrase;
  int nByte;
  Fts3Expr *p;
  int isRequirePhrase;
  int rc;
  char *zIn;
  int nIn;
  Fts3Expr *pNotBranch;
  Fts3Expr *pPrev;
  Fts3Expr *pRet;
  Fts3Expr *pFVar1;
  Fts3Expr *in_stack_ffffffffffffff90;
  int local_54;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar2;
  Fts3Expr *ppExpr_00;
  undefined8 uVar3;
  Fts3Expr *z_00;
  
  z_00 = (Fts3Expr *)0x0;
  uVar3 = 0;
  ppExpr_00 = (Fts3Expr *)0x0;
  local_54 = 0;
  iVar2 = in_EDX;
  while (local_54 == 0) {
    local_54 = getNextNode(in_R8,(char *)z_00,(int)((ulong)uVar3 >> 0x20),(Fts3Expr **)ppExpr_00,
                           (int *)CONCAT44(iVar2,in_stack_ffffffffffffffb8));
  }
  if ((local_54 == 0x65) && (z_00 != (Fts3Expr *)0x0)) {
    local_54 = 1;
  }
  if ((local_54 == 0x65) && (local_54 = 0, ppExpr_00 != (Fts3Expr *)0x0)) {
    pFVar1 = ppExpr_00;
    if (z_00 == (Fts3Expr *)0x0) {
      local_54 = 1;
    }
    else {
      for (; pFVar1->pLeft != (Fts3Expr *)0x0; pFVar1 = pFVar1->pLeft) {
      }
      pFVar1->pLeft = z_00;
      z_00->pParent = pFVar1;
      z_00 = ppExpr_00;
    }
  }
  *(int *)&in_R8->pTokenizer = in_EDX - iVar2;
  if (local_54 != 0) {
    sqlite3Fts3ExprFree(in_stack_ffffffffffffff90);
    sqlite3Fts3ExprFree(in_stack_ffffffffffffff90);
    z_00 = (Fts3Expr *)0x0;
  }
  *in_RCX = z_00;
  return local_54;
}

Assistant:

static int fts3ExprParse(
  ParseContext *pParse,                   /* fts3 query parse context */
  const char *z, int n,                   /* Text of MATCH query */
  Fts3Expr **ppExpr,                      /* OUT: Parsed query structure */
  int *pnConsumed                         /* OUT: Number of bytes consumed */
){
  Fts3Expr *pRet = 0;
  Fts3Expr *pPrev = 0;
  Fts3Expr *pNotBranch = 0;               /* Only used in legacy parse mode */
  int nIn = n;
  const char *zIn = z;
  int rc = SQLITE_OK;
  int isRequirePhrase = 1;

  while( rc==SQLITE_OK ){
    Fts3Expr *p = 0;
    int nByte = 0;

    rc = getNextNode(pParse, zIn, nIn, &p, &nByte);
    assert( nByte>0 || (rc!=SQLITE_OK && p==0) );
    if( rc==SQLITE_OK ){
      if( p ){
        int isPhrase;

        if( !sqlite3_fts3_enable_parentheses 
            && p->eType==FTSQUERY_PHRASE && pParse->isNot 
        ){
          /* Create an implicit NOT operator. */
          Fts3Expr *pNot = fts3MallocZero(sizeof(Fts3Expr));
          if( !pNot ){
            sqlite3Fts3ExprFree(p);
            rc = SQLITE_NOMEM;
            goto exprparse_out;
          }
          pNot->eType = FTSQUERY_NOT;
          pNot->pRight = p;
          p->pParent = pNot;
          if( pNotBranch ){
            pNot->pLeft = pNotBranch;
            pNotBranch->pParent = pNot;
          }
          pNotBranch = pNot;
          p = pPrev;
        }else{
          int eType = p->eType;
          isPhrase = (eType==FTSQUERY_PHRASE || p->pLeft);

          /* The isRequirePhrase variable is set to true if a phrase or
          ** an expression contained in parenthesis is required. If a
          ** binary operator (AND, OR, NOT or NEAR) is encounted when
          ** isRequirePhrase is set, this is a syntax error.
          */
          if( !isPhrase && isRequirePhrase ){
            sqlite3Fts3ExprFree(p);
            rc = SQLITE_ERROR;
            goto exprparse_out;
          }

          if( isPhrase && !isRequirePhrase ){
            /* Insert an implicit AND operator. */
            Fts3Expr *pAnd;
            assert( pRet && pPrev );
            pAnd = fts3MallocZero(sizeof(Fts3Expr));
            if( !pAnd ){
              sqlite3Fts3ExprFree(p);
              rc = SQLITE_NOMEM;
              goto exprparse_out;
            }
            pAnd->eType = FTSQUERY_AND;
            insertBinaryOperator(&pRet, pPrev, pAnd);
            pPrev = pAnd;
          }

          /* This test catches attempts to make either operand of a NEAR
           ** operator something other than a phrase. For example, either of
           ** the following:
           **
           **    (bracketed expression) NEAR phrase
           **    phrase NEAR (bracketed expression)
           **
           ** Return an error in either case.
           */
          if( pPrev && (
            (eType==FTSQUERY_NEAR && !isPhrase && pPrev->eType!=FTSQUERY_PHRASE)
         || (eType!=FTSQUERY_PHRASE && isPhrase && pPrev->eType==FTSQUERY_NEAR)
          )){
            sqlite3Fts3ExprFree(p);
            rc = SQLITE_ERROR;
            goto exprparse_out;
          }

          if( isPhrase ){
            if( pRet ){
              assert( pPrev && pPrev->pLeft && pPrev->pRight==0 );
              pPrev->pRight = p;
              p->pParent = pPrev;
            }else{
              pRet = p;
            }
          }else{
            insertBinaryOperator(&pRet, pPrev, p);
          }
          isRequirePhrase = !isPhrase;
        }
        pPrev = p;
      }
      assert( nByte>0 );
    }
    assert( rc!=SQLITE_OK || (nByte>0 && nByte<=nIn) );
    nIn -= nByte;
    zIn += nByte;
  }

  if( rc==SQLITE_DONE && pRet && isRequirePhrase ){
    rc = SQLITE_ERROR;
  }

  if( rc==SQLITE_DONE ){
    rc = SQLITE_OK;
    if( !sqlite3_fts3_enable_parentheses && pNotBranch ){
      if( !pRet ){
        rc = SQLITE_ERROR;
      }else{
        Fts3Expr *pIter = pNotBranch;
        while( pIter->pLeft ){
          pIter = pIter->pLeft;
        }
        pIter->pLeft = pRet;
        pRet->pParent = pIter;
        pRet = pNotBranch;
      }
    }
  }
  *pnConsumed = n - nIn;

exprparse_out:
  if( rc!=SQLITE_OK ){
    sqlite3Fts3ExprFree(pRet);
    sqlite3Fts3ExprFree(pNotBranch);
    pRet = 0;
  }
  *ppExpr = pRet;
  return rc;
}